

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O1

int nn_binproc_create(nn_ep *ep)

{
  nn_fsm_fn *self;
  int iVar1;
  nn_fsm *self_00;
  nn_ctx *ctx;
  
  self_00 = (nn_fsm *)nn_alloc_(0x90);
  if (self_00 != (nn_fsm *)0x0) {
    self = &self_00[1].shutdown_fn;
    nn_ins_item_init((nn_ins_item *)self,ep);
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root(self_00,nn_binproc_handler,nn_binproc_shutdown,ctx);
    *(undefined4 *)&self_00[1].fn = 1;
    nn_list_init((nn_list *)&self_00[1].ctx);
    nn_fsm_start(self_00);
    iVar1 = nn_ins_bind((nn_ins_item *)self,nn_binproc_connect);
    if (iVar1 < 0) {
      nn_list_term((nn_list *)&self_00[1].ctx);
      self_00->state = 1;
      nn_fsm_term(self_00);
      nn_ins_item_term((nn_ins_item *)self);
      nn_free(self_00);
    }
    else {
      nn_ep_tran_setup(ep,&nn_binproc_ops,self_00);
      iVar1 = 0;
    }
    return iVar1;
  }
  nn_binproc_create_cold_1();
}

Assistant:

int nn_binproc_create (struct nn_ep *ep)
{
    int rc;
    struct nn_binproc *self;

    self = nn_alloc (sizeof (struct nn_binproc), "binproc");
    alloc_assert (self);

    nn_ins_item_init (&self->item, ep);
    nn_fsm_init_root (&self->fsm, nn_binproc_handler, nn_binproc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BINPROC_STATE_IDLE;
    nn_list_init (&self->sinprocs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    rc = nn_ins_bind (&self->item, nn_binproc_connect);
    if (rc < 0) {
        nn_list_term (&self->sinprocs);

        /*  TODO: Now, this is ugly! We are getting the state machine into
            the idle state manually. How should it be done correctly? */
        self->fsm.state = 1;
        nn_fsm_term (&self->fsm);

        nn_ins_item_term (&self->item);
        nn_free (self);
        return rc;
    }

    nn_ep_tran_setup (ep, &nn_binproc_ops, self);
    return 0;
}